

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_Dsd6FindSupportOne(Dau_Dsd_t *p,word tCof0,word tCof1,int *pVars,int nVars,int v,int u)

{
  int iVar1;
  uint local_38;
  uint local_34;
  int Status;
  int v_local;
  int nVars_local;
  int *pVars_local;
  word tCof1_local;
  word tCof0_local;
  Dau_Dsd_t *p_local;
  
  if (p == (Dau_Dsd_t *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = Dau_DsdLookupVarCache(p,pVars[v],pVars[u]);
  }
  local_34 = local_38;
  if (local_38 == 0) {
    iVar1 = Abc_Tt6HasVar(tCof1,u);
    local_34 = Abc_Tt6HasVar(tCof0,u);
    local_34 = iVar1 << 1 | local_34;
    if (p != (Dau_Dsd_t *)0x0) {
      Dau_DsdInsertVarCache(p,pVars[v],pVars[u],local_34);
    }
  }
  return local_34;
}

Assistant:

static inline int Dau_Dsd6FindSupportOne( Dau_Dsd_t * p, word tCof0, word tCof1, int * pVars, int nVars, int v, int u )
{
    int Status = p ? Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) : 0;
    if ( Status == 0 )
    {
        Status = (Abc_Tt6HasVar(tCof1, u) << 1) | Abc_Tt6HasVar(tCof0, u);
        if ( p )
            Dau_DsdInsertVarCache( p, pVars[v], pVars[u], Status );
    }
    return Status;
}